

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab::compute_cdf(tab *this)

{
  reference pvVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vec2 local_e4;
  vec2 local_dc;
  vec2 local_d4;
  float local_cc;
  value_type vStack_c8;
  float_t tmp;
  vec2 nint2;
  int idx;
  float_t dp;
  float_t ndf;
  vec3 wm;
  float_t spm;
  float_t cpm;
  float_t pm;
  float_t u1;
  int i1_1;
  double nint;
  float_t stm;
  float_t ctm;
  float_t tm;
  float_t u2;
  int i2;
  int local_6c;
  undefined1 local_68 [4];
  int i1;
  vec3 wi;
  float_t z_i;
  float_t zi;
  float_t ti;
  float_t u_1;
  int i3;
  float_t spi;
  float_t cpi;
  float_t pi;
  float_t u;
  int i4;
  double du1;
  double du2;
  int nu1;
  int nu2;
  int nti;
  int npi;
  tab *this_local;
  
  fVar2 = m_pi();
  fVar3 = m_pi();
  for (pi = 0.0; (int)pi < 0x20; pi = (float_t)((int)pi + 1)) {
    fVar4 = m_pi();
    fVar5 = ((float)(int)pi / 32.0 + (float)(int)pi / 32.0 + -1.0) * fVar4;
    dVar8 = std::cos((double)(ulong)(uint)fVar5);
    dVar9 = std::sin((double)(ulong)(uint)fVar5);
    for (ti = 0.0; (int)ti < 0x10; ti = (float_t)((int)ti + 1)) {
      dVar10 = std::sqrt((double)(ulong)(uint)((float)(int)ti / 15.0));
      fVar4 = m_pi();
      fVar5 = (SUB84(dVar10,0) * fVar4) / 2.0;
      dVar10 = std::cos((double)(ulong)(uint)fVar5);
      wi.z = SUB84(dVar10,0);
      fVar6 = sat<float>(&wi.z);
      dVar10 = std::sin((double)(ulong)(uint)fVar5);
      wi.y = SUB84(dVar10,0);
      vec3::vec3((vec3 *)local_68,wi.y * SUB84(dVar8,0),wi.y * SUB84(dVar9,0),fVar6);
      for (local_6c = 0; local_6c < 0x200; local_6c = local_6c + 1) {
        vec2::vec2((vec2 *)&u2,0.0);
        std::vector<djb::vec2,_std::allocator<djb::vec2>_>::push_back
                  (&this->m_cdf,(value_type *)&u2);
      }
      for (tm = 1.4013e-45; (int)tm < 0x40; tm = (float_t)((int)tm + 1)) {
        ctm = (float)(int)tm / 64.0;
        fVar5 = sqr<float>(&ctm);
        fVar4 = m_pi();
        fVar5 = (fVar5 * fVar4) / 2.0;
        dVar10 = std::cos((double)(ulong)(uint)fVar5);
        dVar11 = std::sin((double)(ulong)(uint)fVar5);
        fVar6 = SUB84(dVar11,0);
        fVar5 = 0.0;
        for (pm = 0.0; (int)pm < 0x200; pm = (float_t)((int)pm + 1)) {
          fVar4 = m_pi();
          fVar7 = ((float)(int)pm / 512.0 + (float)(int)pm / 512.0 + -1.0) * fVar4;
          dVar11 = std::cos((double)(ulong)(uint)fVar7);
          wm.z = SUB84(dVar11,0);
          dVar11 = std::sin((double)(ulong)(uint)fVar7);
          wm.y = SUB84(dVar11,0);
          vec3::vec3((vec3 *)&dp,fVar6 * wm.z,fVar6 * wm.y,SUB84(dVar10,0));
          (*(this->super_microfacet).super_brdf._vptr_brdf[0xb])(this,(vec3 *)&dp);
          nint2.y = dot((vec3 *)&dp,(vec3 *)local_68);
          fVar7 = sat<float>(&nint2.y);
          nint2.x = (float_t)((int)pm + ((int)tm + -1 + ((int)ti + (int)pi * 0x10) * 0x40) * 0x200);
          pvVar1 = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::operator[]
                             (&this->m_cdf,(long)(int)nint2.x);
          vStack_c8 = *pvVar1;
          local_cc = fVar7 * extraout_XMM0_Da * ctm * fVar6;
          fVar5 = fVar5 + local_cc;
          vec2::vec2(&local_e4,fVar5 * ((fVar3 * 2.0) / 64.0),local_cc);
          local_dc = djb::operator*(&local_e4,fVar2 / 512.0);
          local_d4 = djb::operator+(&local_dc,&stack0xffffffffffffff38);
          std::vector<djb::vec2,_std::allocator<djb::vec2>_>::push_back(&this->m_cdf,&local_d4);
        }
      }
    }
  }
  fprintf(_stdout,"djb_verbose: CDF ready\n");
  return;
}

Assistant:

void tab::compute_cdf()
{
	int npi = 32;
	int nti = 16;
	int nu2 = 64;
	int nu1 = 512;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i4 = 0; i4 < npi; ++i4) {
		float_t u = (float_t)i4 / npi;   // in [0,1)
		float_t pi = (2 * u - 1) * m_pi(); // in [-pi,pi)
		float_t cpi = cos(pi), spi = sin(pi);

		for (int i3 = 0; i3 < nti; ++i3) {
			float_t u = (float_t)i3 / (nti - 1); // in [0,1]
			float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
			float_t zi = sat(cos(ti)), z_i = sin(ti);
			vec3 wi = vec3(z_i * cpi, z_i * spi, zi);

			// bottom row (zeroes since z_m = 0)
			for (int i1 = 0; i1 < nu1; ++i1)
				m_cdf.push_back(vec2(0));

			// rest of the domain
			for (int i2 = 1; i2 < nu2; ++i2) {
				float_t u2 = (float_t)i2 / nu2;   // in (0,1)
				float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
				float_t ctm = cos(tm), stm = sin(tm);
				double nint = 0;

				for (int i1 = 0; i1 < nu1; ++i1) {
					float_t u1 = (float_t)i1 / nu1;    // in [0,1)
					float_t pm = (2 * u1 - 1) * m_pi();  // in [phi_i-pi/2,phi_i+pi/2)
					float_t cpm = cos(pm), spm = sin(pm);
					vec3 wm = vec3(stm * cpm, stm * spm, ctm);
					float_t ndf = ndf_std(wm);
					float_t dp = sat(dot(wm, wi));
					int idx = i1 + nu1 * (i2 - 1 + nu2 * (i3 + nti * i4));
					vec2 nint2 = m_cdf[idx];
					float_t tmp = dp * ndf * u2 * stm;

					nint+= (double)tmp;
					m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
				}
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}